

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O0

float ** Llb_ManComputeAttr(Llb_Mtr_t *p)

{
  float **ppfVar1;
  float fVar2;
  int local_20;
  int local_1c;
  int k;
  int i;
  float **pCosts;
  Llb_Mtr_t *p_local;
  
  ppfVar1 = (float **)Extra_ArrayAlloc(p->nCols,p->nCols,4);
  for (local_1c = 0; local_1c < p->nCols; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < p->nCols; local_20 = local_20 + 1) {
      ppfVar1[local_1c][local_1c] = 0.0;
    }
  }
  for (local_1c = 1; local_20 = local_1c, local_1c < p->nCols + -1; local_1c = local_1c + 1) {
    while (local_20 = local_20 + 1, local_20 < p->nCols + -1) {
      fVar2 = Llb_ManComputeCommonAttr(p,local_1c,local_20);
      ppfVar1[local_20][local_1c] = fVar2;
      ppfVar1[local_1c][local_20] = fVar2;
    }
  }
  return ppfVar1;
}

Assistant:

float ** Llb_ManComputeAttr( Llb_Mtr_t * p )
{
    float ** pCosts;
    int i, k;
    // alloc and clean
    pCosts = (float **)Extra_ArrayAlloc( p->nCols, p->nCols, sizeof(float) );
    for ( i = 0; i < p->nCols; i++ )
    for ( k = 0; k < p->nCols; k++ )
        pCosts[i][i] = 0.0;
    // fill up
    for ( i = 1; i < p->nCols-1; i++ )
    for ( k = i+1; k < p->nCols-1; k++ )
        pCosts[i][k] = pCosts[k][i] = Llb_ManComputeCommonAttr( p, i, k );
    return pCosts;
}